

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# butterworth.cc
# Opt level: O0

void __thiscall Butterworth::MkLowPass(Butterworth *this,float freq)

{
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float lambda;
  
  dVar2 = tan(((double)in_XMM0_Da * 3.141592653589793) / 44100.0);
  fVar1 = (float)(1.0 / dVar2);
  auVar3._0_8_ = (double)fVar1;
  auVar3._8_8_ = 0;
  auVar3 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar3,ZEXT816(0x3ff0000000000000));
  *(double *)(in_RDI + 0x20) = 1.0 / (auVar3._0_8_ + (double)(fVar1 * fVar1));
  *(double *)(in_RDI + 0x28) = *(double *)(in_RDI + 0x20) * 2.0;
  *(undefined8 *)(in_RDI + 0x30) = *(undefined8 *)(in_RDI + 0x20);
  *(double *)(in_RDI + 0x38) = *(double *)(in_RDI + 0x20) * 2.0 * (1.0 - (double)(fVar1 * fVar1));
  auVar4._0_8_ = (double)fVar1;
  auVar4._8_8_ = 0;
  auVar3 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar4,ZEXT816(0x3ff0000000000000));
  *(double *)(in_RDI + 0x40) = *(double *)(in_RDI + 0x20) * (auVar3._0_8_ + (double)(fVar1 * fVar1))
  ;
  return;
}

Assistant:

void Butterworth::MkLowPass(float freq)
{
    float lambda = 1. / tan(M_TAUOVR2 * freq / 44100.);
    a_[0] = 1. / (1. + 2. * lambda + lambda * lambda);
    a_[1] = 2. * a_[0];
    a_[2] = a_[0];

    b_[0] = 2. * a_[0] * (1. - lambda * lambda);
    b_[1] = a_[0] * (1. - 2. * lambda + lambda * lambda);
}